

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c
# Opt level: O3

void prvTidyDialogue(TidyDocImpl *doc,uint code,...)

{
  TidyReportLevel level;
  long lVar1;
  _dialogueDispatchTable *p_Var2;
  TidyMessageImpl *message;
  long lVar3;
  va_list args;
  undefined8 local_a8;
  
  if (code == 0x1fa) {
    p_Var2 = dialogueDispatchTable;
  }
  else {
    lVar1 = 0;
    do {
      lVar3 = lVar1;
      if (lVar3 == 0xd8) {
        return;
      }
      lVar1 = lVar3 + 8;
    } while (*(uint *)((long)&dialogueDispatchTable[1].code + lVar3) != code);
    p_Var2 = (_dialogueDispatchTable *)(lVar3 + 0x161298);
  }
  level = p_Var2->level;
  if ((int)code < 0x21b) {
    if ((code == 0x212) || (code == 0x219)) {
      message = prvTidytidyMessageCreate(doc,code,level,local_a8);
      goto LAB_0014cbb5;
    }
  }
  else if ((code == 0x21b) || (code == 0x21e)) {
    message = prvTidytidyMessageCreate
                        (doc,code,level,(ulong)doc->warnings,"STRING_ERROR_COUNT_WARNING",
                         (ulong)doc->errors,"STRING_ERROR_COUNT_ERROR");
    goto LAB_0014cbb5;
  }
  message = prvTidytidyMessageCreate(doc,code,level);
LAB_0014cbb5:
  messageOut(message);
  return;
}

Assistant:

void TY_(Dialogue)(TidyDocImpl* doc, uint code, ...)
{
    int i = 0;
    va_list args;

    while ( dialogueDispatchTable[i].code != 0 )
    {
        if ( dialogueDispatchTable[i].code == code )
        {
            TidyMessageImpl *message;
            TidyReportLevel level = dialogueDispatchTable[i].level;
            va_start(args, code);
            message = formatDialogue( doc, code, level, args );
            va_end(args);
            messageOut( message );
            break;
        }
        i++;
    }
}